

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void bloaty::AddDIE(CU *cu,GeneralDIE *die,DualMap *symbol_map,RangeSink *sink)

{
  string *name;
  File *off;
  bool bVar1;
  uchar uVar2;
  uint uVar3;
  CU *pCVar4;
  unsigned_long uVar5;
  uint64_t uVar6;
  unsigned_long uVar7;
  uint64_t uVar8;
  long lVar9;
  RangeSink *pRVar10;
  ulong uVar11;
  pointer pcVar12;
  char *analyzer;
  size_t sVar15;
  string_view name_00;
  string_view data;
  string_view data_00;
  basic_string_view<char,_std::char_traits<char>_> bVar16;
  string_view sVar17;
  string_view sVar18;
  string_view name_01;
  string_view name_02;
  string_view file_range;
  CU *pCVar19;
  string_view location;
  uint64_t local_50;
  uint64_t size;
  Rep *local_38;
  char *pcVar13;
  size_type sVar14;
  
  pRVar10 = sink;
  pCVar4 = (CU *)TryReadPcPair(cu,die,sink);
  if ((die->location_string).
      super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>.
      _M_payload.
      super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
      _M_engaged == true) {
    pRVar10 = (RangeSink *)
              (die->location_string).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_len;
    pcVar13 = (die->location_string).
              super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
              ._M_payload.
              super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
              _M_payload._M_value._M_str;
    location = (die->location_string).
               super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
               ._M_payload.
               super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>.
               _M_payload._M_value;
    bVar1 = (cu->unit_sizes_).addr8_;
    if ((pRVar10 == (RangeSink *)((ulong)bVar1 * 4 + 5)) && (*pcVar13 == '\x03')) {
      pRVar10 = (RangeSink *)((long)&pRVar10[-1].arena_ + 7);
      location._M_str = pcVar13 + 1;
      location._M_len = (size_t)pRVar10;
      if (bVar1 == false) {
        uVar3 = ReadFixed<unsigned_int,4ul>(&location);
        uVar5 = (unsigned_long)uVar3;
      }
      else {
        uVar5 = ReadFixed<unsigned_long,8ul>(&location);
      }
      bVar1 = RangeMap::TryGetSize(&symbol_map->vm_map,uVar5,&size);
      if (bVar1) {
        pRVar10 = (RangeSink *)size;
        RangeSink::AddVMRangeIgnoreDuplicate(sink,"dwarf_location",uVar5,size,&cu->unit_name_);
      }
      else if (0 < verbose_level) {
        pRVar10 = (RangeSink *)(cu->unit_name_)._M_dataplus._M_p;
        fprintf(_stderr,
                "bloaty: warning: couldn\'t find DWARF location in symbol table, address: %lx, name: %s\n"
                ,uVar5);
      }
    }
  }
  if ((die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar11 = (die->location_uint64).super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_payload._M_value;
    if (uVar11 < (cu->dwarf_->debug_loc)._M_len) {
      pCVar19 = cu;
      bVar16 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                         (&cu->dwarf_->debug_loc,uVar11,0xffffffffffffffff);
      sVar17._M_len = bVar16._M_str;
      sVar17._M_str = (char *)pRVar10;
      sVar17 = dwarf::GetLocationListRange
                         ((dwarf *)(ulong)(uint)cu->unit_sizes_,bVar16._M_len._0_4_,sVar17);
      pRVar10 = (RangeSink *)(cu->unit_name_)._M_dataplus._M_p;
      name_01._M_str = (char *)pRVar10;
      name_01._M_len = (cu->unit_name_)._M_string_length;
      RangeSink::AddFileRange(sink,"dwarf_locrange",name_01,sVar17);
      cu = pCVar19;
    }
    else {
      pRVar10 = (RangeSink *)&verbose_level;
      if (0 < verbose_level) {
        pRVar10 = (RangeSink *)&stderr;
        fprintf(_stderr,"bloaty: warning: DWARF location out of range, location=%lx\n",uVar11);
      }
    }
  }
  if ((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_long>._M_engaged == true) {
    uVar11 = CONCAT71((int7)((ulong)pRVar10 >> 8),(cu->unit_sizes_).dwarf64_) | 2;
    data._M_str = (char *)(((die->rnglistx).super__Optional_base<unsigned_long,_true,_true>.
                            _M_payload.super__Optional_payload_base<unsigned_long>._M_payload.
                            _M_value << ((byte)uVar11 & 0x3f)) + cu->range_lists_base_);
    data._M_len = (size_t)(cu->dwarf_->debug_rnglists)._M_str;
    pCVar4 = cu;
    location = StrictSubstr((bloaty *)(cu->dwarf_->debug_rnglists)._M_len,data,uVar11);
    uVar6 = dwarf::CompilationUnitSizes::ReadDWARFOffset(&cu->unit_sizes_,&location);
    off = cu->dwarf_;
    data_00._M_str = (char *)(uVar6 + cu->range_lists_base_);
    data_00._M_len = (size_t)(off->debug_rnglists)._M_str;
    sVar18 = StrictSubstr((bloaty *)(off->debug_rnglists)._M_len,data_00,(size_t)off);
    pcVar13 = sVar18._M_str;
    local_50 = cu->addr_base_;
    name = &cu->unit_name_;
switchD_0019e41d_default:
    local_38 = (Rep *)sVar18._M_str;
    size = sVar18._M_len;
    uVar2 = ReadFixed<unsigned_char,1ul>((string_view *)&size);
    sVar18._M_str = (char *)local_38;
    sVar18._M_len = size;
    switch(uVar2) {
    case '\0':
      goto switchD_0019e41d_caseD_0;
    case '\x01':
      uVar5 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      local_50 = dwarf::ReadIndirectAddress(cu,uVar5);
      sVar18._M_str = (char *)local_38;
      sVar18._M_len = size;
      goto switchD_0019e41d_default;
    case '\x02':
      uVar5 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      uVar6 = dwarf::ReadIndirectAddress(cu,uVar5);
      uVar5 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      uVar8 = dwarf::ReadIndirectAddress(cu,uVar5);
      uVar8 = uVar8 - uVar6;
      break;
    case '\x03':
      uVar5 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      uVar6 = dwarf::ReadIndirectAddress(cu,uVar5);
      uVar8 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      break;
    case '\x04':
      uVar5 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      uVar6 = uVar5 + local_50;
      cu = pCVar4;
      uVar7 = dwarf::ReadLEB128<unsigned_long>((string_view *)&size);
      uVar8 = uVar7 - uVar5;
      pCVar4 = cu;
      break;
    case '\x05':
    case '\x06':
    case '\a':
      Throw("NYI",0x1fe);
    default:
      goto switchD_0019e41d_default;
    }
    RangeSink::AddVMRangeIgnoreDuplicate(sink,"dwarf_rangelst",uVar6,uVar8,name);
    sVar18._M_str = (char *)local_38;
    sVar18._M_len = size;
    goto switchD_0019e41d_default;
  }
  lVar9 = 0x90;
  if (((die->ranges).super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged == false) &&
     (lVar9 = 0xa0,
     (die->start_scope).super__Optional_base<unsigned_long,_true,_true>._M_payload.
     super__Optional_payload_base<unsigned_long>._M_engaged != true)) {
    return;
  }
  uVar11 = *(ulong *)((long)&(die->name).
                             super__Optional_base<std::basic_string_view<char,_std::char_traits<char>_>,_true,_true>
                             ._M_payload.
                             super__Optional_payload_base<std::basic_string_view<char,_std::char_traits<char>_>_>
                             ._M_payload + lVar9);
  if (uVar11 == 0xffffffffffffffff) {
    return;
  }
  if ((cu->dwarf_->debug_ranges)._M_len <= uVar11) {
    if (verbose_level < 1) {
      return;
    }
    fprintf(_stderr,"bloaty: warning: DWARF debug range out of range, ranges_offset=%lx\n",uVar11);
    return;
  }
  pCVar19 = cu;
  location = std::basic_string_view<char,_std::char_traits<char>_>::substr
                       (&cu->dwarf_->debug_ranges,uVar11,0xffffffffffffffff);
  pcVar13 = location._M_str;
  name_00._M_str = (char *)sink;
  name_00._M_len = (size_t)(cu->unit_name_)._M_dataplus._M_p;
  dwarf::ReadRangeList
            ((dwarf *)cu,pCVar4,(cu->unit_name_)._M_string_length,name_00,(RangeSink *)&location,
             (string_view *)pCVar19);
  sVar15 = (long)location._M_str - (long)pcVar13;
  pcVar12 = (cu->unit_name_)._M_dataplus._M_p;
  sVar14 = (cu->unit_name_)._M_string_length;
  analyzer = "dwarf_debugrange";
LAB_0019e598:
  name_02._M_str = pcVar12;
  name_02._M_len = sVar14;
  file_range._M_str = pcVar13;
  file_range._M_len = sVar15;
  RangeSink::AddFileRange(sink,analyzer,name_02,file_range);
  return;
switchD_0019e41d_caseD_0:
  sVar15 = (long)local_38 - (long)pcVar13;
  pcVar12 = (cu->unit_name_)._M_dataplus._M_p;
  sVar14 = (cu->unit_name_)._M_string_length;
  analyzer = "dwarf_rangelst_addrs";
  goto LAB_0019e598;
}

Assistant:

void AddDIE(const dwarf::CU& cu, const GeneralDIE& die,
            const DualMap& symbol_map, RangeSink* sink) {
  uint64_t low_pc = TryReadPcPair(cu, die, sink);

  // Sometimes the DIE has a "location", which gives the location as an address.
  // This parses a very small subset of the overall DWARF expression grammar.
  if (die.location_string) {
    string_view location = *die.location_string;
    if (location.size() == cu.unit_sizes().address_size() + 1 &&
        location[0] == DW_OP_addr) {
      location.remove_prefix(1);
      uint64_t addr;
      // TODO(haberman): endian?
      if (cu.unit_sizes().address_size() == 4) {
        addr = ReadFixed<uint32_t>(&location);
      } else if (cu.unit_sizes().address_size() == 8) {
        addr = ReadFixed<uint64_t>(&location);
      } else {
        BLOATY_UNREACHABLE();
      }

      // Unfortunately the location doesn't include a size, so we look that part
      // up in the symbol map.
      uint64_t size;
      if (symbol_map.vm_map.TryGetSize(addr, &size)) {
        sink->AddVMRangeIgnoreDuplicate("dwarf_location", addr, size,
                                        cu.unit_name());
      } else {
        if (verbose_level > 0) {
          fprintf(stderr,
                  "bloaty: warning: couldn't find DWARF location in symbol "
                  "table, address: %" PRIx64 ", name: %s\n",
                  addr, cu.unit_name().c_str());
        }
      }
    }
  }

  // Sometimes a location is given as an offset into debug_loc.
  if (die.location_uint64) {
    uint64_t location = *die.location_uint64;;
    if (location < cu.dwarf().debug_loc.size()) {
      std::string_view loc_range = cu.dwarf().debug_loc.substr(location);
      loc_range = GetLocationListRange(cu.unit_sizes(), loc_range);
      sink->AddFileRange("dwarf_locrange", cu.unit_name(), loc_range);
    } else if (verbose_level > 0) {
      fprintf(stderr,
              "bloaty: warning: DWARF location out of range, location=%" PRIx64
              "\n",
              location);
    }
  }

  // DWARF 5 range list is the same information as "ranges" but in a different
  // format.
  if (die.rnglistx) {
    uint64_t range_list = *die.rnglistx;
    size_t offset_size = cu.unit_sizes().dwarf64() ? 8 : 4;
    string_view offset_data =
        StrictSubstr(cu.dwarf().debug_rnglists,
                     cu.range_lists_base() + (range_list * offset_size));
    uint64_t offset = cu.unit_sizes().ReadDWARFOffset(&offset_data);
    string_view data = StrictSubstr(
        cu.dwarf().debug_rnglists, cu.range_lists_base() + offset);
    const char* start = data.data();
    bool done = false;
    uint64_t base_address = cu.addr_base();
    while (!done) {
      switch (ReadFixed<uint8_t>(&data)) {
        case DW_RLE_end_of_list:
          done = true;
          break;
        case DW_RLE_base_addressx:
          base_address =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          break;
        case DW_RLE_startx_endx: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t end =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_startx_length: {
          uint64_t start =
              ReadIndirectAddress(cu, dwarf::ReadLEB128<uint64_t>(&data));
          uint64_t length = dwarf::ReadLEB128<uint64_t>(&data);
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, length,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_offset_pair: {
          uint64_t start = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          uint64_t end = dwarf::ReadLEB128<uint64_t>(&data) + base_address;
          sink->AddVMRangeIgnoreDuplicate("dwarf_rangelst", start, end - start,
                                          cu.unit_name());
          break;
        }
        case DW_RLE_base_address:
        case DW_RLE_start_end:
        case DW_RLE_start_length:
          THROW("NYI");
          break;
      }
    }
    string_view all(start, data.data() - start);
    sink->AddFileRange("dwarf_rangelst_addrs", cu.unit_name(), all);
  } else {
    uint64_t ranges_offset = UINT64_MAX;

    // There are two different attributes that sometimes contain an offset into
    // debug_ranges.
    if (die.ranges) {
      ranges_offset = *die.ranges;
    } else if (die.start_scope) {
      ranges_offset = *die.start_scope;
    }

    if (ranges_offset != UINT64_MAX) {
      if (ranges_offset < cu.dwarf().debug_ranges.size()) {
        std::string_view data = cu.dwarf().debug_ranges.substr(ranges_offset);
        const char* start = data.data();
        ReadRangeList(cu, low_pc, cu.unit_name(), sink, &data);
        string_view all(start, data.data() - start);
        sink->AddFileRange("dwarf_debugrange", cu.unit_name(), all);
      } else if (verbose_level > 0) {
        fprintf(stderr,
                "bloaty: warning: DWARF debug range out of range, "
                "ranges_offset=%" PRIx64 "\n",
                ranges_offset);
      }
    }
  }
}